

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

AddMeshError xatlas::AddUvMesh(Atlas *atlas,UvMeshDecl *decl)

{
  float *__src;
  uint32_t *puVar1;
  undefined *puVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  UvMesh *pUVar6;
  UvMesh **ppUVar7;
  uint *puVar8;
  Vector2 *pVVar9;
  Vector2 *pVVar10;
  Vector2 *pVVar11;
  float fVar12;
  uint32_t local_dc;
  uint32_t local_a0;
  float area;
  Vector2 *v3;
  Vector2 *v2;
  Vector2 *v1;
  uint local_78;
  uint32_t vertex;
  uint32_t i_4;
  uint32_t i_3;
  uint32_t tri [3];
  uint uStack_5c;
  bool ignore;
  uint32_t f;
  uint32_t warningCount;
  uint32_t kMaxWarnings;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t m;
  UvMesh *mesh;
  UvMeshInstance *meshInstance;
  uint32_t index;
  uint32_t i;
  uint32_t indexCount;
  bool hasIndices;
  Context *ctx;
  UvMeshDecl *decl_local;
  Atlas *atlas_local;
  
  ctx = (Context *)decl;
  decl_local = (UvMeshDecl *)atlas;
  if (atlas == (Atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x2431,"AddMeshError xatlas::AddUvMesh(Atlas *, const UvMeshDecl &)");
  }
  if (atlas == (Atlas *)0x0) {
    if (internal::s_print != (undefined *)0x0) {
      (*(code *)internal::s_print)("AddUvMesh: atlas is null.\n");
    }
    atlas_local._4_4_ = Error;
  }
  else {
    _indexCount = atlas;
    bVar3 = internal::Array<xatlas::internal::Mesh_*>::isEmpty
                      ((Array<xatlas::internal::Mesh_*> *)&atlas[3].width);
    puVar2 = internal::s_print;
    if (bVar3) {
      i._3_1_ = (ctx->atlas).atlasCount != 0;
      if ((bool)i._3_1_) {
        local_a0 = (ctx->atlas).atlasCount;
      }
      else {
        local_a0 = (ctx->atlas).width;
      }
      index = local_a0;
      if ((internal::s_print != (undefined *)0x0) && ((internal::s_printVerbose & 1) != 0)) {
        uVar4 = internal::Array<xatlas::internal::UvMesh_*>::size
                          ((Array<xatlas::internal::UvMesh_*> *)&_indexCount[4].width);
        (*(code *)puVar2)("Adding UV mesh %d: %u vertices, %u triangles\n",uVar4,(ctx->atlas).width,
                          (ulong)index / 3);
      }
      if (index % 3 == 0) {
        if ((i._3_1_ & 1) != 0) {
          for (meshInstance._4_4_ = 0; meshInstance._4_4_ < index;
              meshInstance._4_4_ = meshInstance._4_4_ + 1) {
            meshInstance._0_4_ =
                 DecodeIndex((ctx->atlas).meshCount,(ctx->atlas).meshes,(ctx->atlas).chartCount,
                             meshInstance._4_4_);
            if ((ctx->atlas).width <= (uint32_t)meshInstance) {
              return IndexOutOfRange;
            }
          }
        }
        pUVar6 = (UvMesh *)
                 internal::Realloc((void *)0x0,0x20,0,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                                   ,0x244f);
        memset(pUVar6,0,0x20);
        internal::UvMeshInstance::UvMeshInstance((UvMeshInstance *)pUVar6);
        (pUVar6->decl).vertexUvData = (UvMesh *)0x0;
        mesh = pUVar6;
        internal::Array<xatlas::internal::UvMeshInstance_*>::push_back
                  ((Array<xatlas::internal::UvMeshInstance_*> *)(_indexCount + 5),
                   (UvMeshInstance **)&mesh);
        _i_1 = (UvMesh *)0x0;
        for (i_2 = 0; uVar4 = internal::Array<xatlas::internal::UvMesh_*>::size
                                        ((Array<xatlas::internal::UvMesh_*> *)&_indexCount[4].width)
            , i_2 < uVar4; i_2 = i_2 + 1) {
          ppUVar7 = internal::Array<xatlas::internal::UvMesh_*>::operator[]
                              ((Array<xatlas::internal::UvMesh_*> *)&_indexCount[4].width,i_2);
          iVar5 = memcmp(*ppUVar7,ctx,0x30);
          if (iVar5 == 0) {
            ppUVar7 = internal::Array<xatlas::internal::UvMesh_*>::operator[]
                                ((Array<xatlas::internal::UvMesh_*> *)&_indexCount[4].width,i_2);
            _i_1 = *ppUVar7;
            if ((internal::s_print != (undefined *)0x0) && ((internal::s_printVerbose & 1) != 0)) {
              (*(code *)internal::s_print)("   instance of a previous UV mesh\n");
            }
            break;
          }
        }
        if (_i_1 == (UvMesh *)0x0) {
          pUVar6 = (UvMesh *)
                   internal::Realloc((void *)0x0,200,0,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                                     ,0x245d);
          memset(pUVar6,0,200);
          internal::UvMesh::UvMesh(pUVar6);
          _i_1 = pUVar6;
          internal::Array<xatlas::internal::UvMesh_*>::push_back
                    ((Array<xatlas::internal::UvMesh_*> *)&_indexCount[4].width,(UvMesh **)&i_1);
          memcpy(_i_1,ctx,0x2c);
          if ((ctx->atlas).utilization != (float *)0x0) {
            internal::Array<unsigned_int>::resize(&_i_1->faceMaterials,(ctx->atlas).atlasCount / 3);
            puVar8 = internal::Array<unsigned_int>::data(&_i_1->faceMaterials);
            __src = (ctx->atlas).utilization;
            uVar4 = internal::Array<unsigned_int>::size(&_i_1->faceMaterials);
            memcpy(puVar8,__src,(ulong)uVar4 << 2);
          }
          internal::Array<unsigned_int>::resize(&_i_1->indices,(ctx->atlas).atlasCount);
          for (kMaxWarnings = 0; kMaxWarnings < index; kMaxWarnings = kMaxWarnings + 1) {
            if ((i._3_1_ & 1) == 0) {
              local_dc = kMaxWarnings;
            }
            else {
              local_dc = DecodeIndex((ctx->atlas).meshCount,(ctx->atlas).meshes,
                                     (ctx->atlas).chartCount,kMaxWarnings);
            }
            puVar8 = internal::Array<unsigned_int>::operator[](&_i_1->indices,kMaxWarnings);
            *puVar8 = local_dc;
          }
          internal::Array<xatlas::internal::Vector2>::resize(&_i_1->texcoords,(ctx->atlas).width);
          for (warningCount = 0; warningCount < (ctx->atlas).width; warningCount = warningCount + 1)
          {
            puVar1 = (ctx->atlas).image;
            uVar4 = (ctx->atlas).height;
            pVVar9 = internal::Array<xatlas::internal::Vector2>::operator[]
                               (&_i_1->texcoords,warningCount);
            *pVVar9 = *(Vector2 *)((long)puVar1 + (ulong)(uVar4 * warningCount));
          }
          internal::BitArray::resize(&_i_1->faceIgnore,(ctx->atlas).atlasCount / 3);
          internal::BitArray::zeroOutMemory(&_i_1->faceIgnore);
          uStack_5c = 0;
          for (tri[2] = 0; tri[2] < index / 3; tri[2] = tri[2] + 1) {
            tri[1]._3_1_ = 0;
            for (vertex = 0; vertex < 3; vertex = vertex + 1) {
              puVar8 = internal::Array<unsigned_int>::operator[](&_i_1->indices,tri[2] * 3 + vertex)
              ;
              (&i_4)[vertex] = *puVar8;
            }
            for (local_78 = 0; local_78 < 3; local_78 = local_78 + 1) {
              uVar4 = (&i_4)[local_78];
              pVVar9 = internal::Array<xatlas::internal::Vector2>::operator[]
                                 (&_i_1->texcoords,uVar4);
              bVar3 = internal::isNan(pVVar9->x);
              if (bVar3) {
LAB_00121d1b:
                tri[1]._3_1_ = 1;
                uStack_5c = uStack_5c + 1;
                if (((uStack_5c < 0x33) && (internal::s_print != (undefined *)0x0)) &&
                   ((internal::s_printVerbose & 1) != 0)) {
                  (*(code *)internal::s_print)("   NAN texture coordinate in vertex %u\n",uVar4);
                }
                break;
              }
              pVVar9 = internal::Array<xatlas::internal::Vector2>::operator[]
                                 (&_i_1->texcoords,uVar4);
              bVar3 = internal::isNan(pVVar9->y);
              if (bVar3) goto LAB_00121d1b;
            }
            if ((tri[1]._3_1_ & 1) == 0) {
              pVVar9 = internal::Array<xatlas::internal::Vector2>::operator[](&_i_1->texcoords,i_4);
              pVVar10 = internal::Array<xatlas::internal::Vector2>::operator[](&_i_1->texcoords,i_3)
              ;
              pVVar11 = internal::Array<xatlas::internal::Vector2>::operator[]
                                  (&_i_1->texcoords,tri[0]);
              fVar12 = ABS(((pVVar10->x - pVVar9->x) * (pVVar11->y - pVVar9->y) +
                           -((pVVar11->x - pVVar9->x) * (pVVar10->y - pVVar9->y))) * 0.5);
              if (fVar12 <= 1.1920929e-07) {
                tri[1]._3_1_ = 1;
                uStack_5c = uStack_5c + 1;
                if (((uStack_5c < 0x33) && (internal::s_print != (undefined *)0x0)) &&
                   ((internal::s_printVerbose & 1) != 0)) {
                  (*(code *)internal::s_print)
                            ((double)fVar12,
                             "   Zero area face: %d, indices (%d %d %d), area is %f\n",tri[2],i_4,
                             i_3,tri[0]);
                }
              }
            }
            if ((tri[1]._3_1_ & 1) != 0) {
              internal::BitArray::set(&_i_1->faceIgnore,tri[2]);
            }
          }
          if (((0x32 < uStack_5c) && (internal::s_print != (undefined *)0x0)) &&
             ((internal::s_printVerbose & 1) != 0)) {
            (*(code *)internal::s_print)("   %u additional warnings truncated\n",uStack_5c - 0x32);
          }
        }
        (mesh->decl).vertexUvData = _i_1;
        atlas_local._4_4_ = Success;
      }
      else {
        atlas_local._4_4_ = InvalidIndexCount;
      }
    }
    else {
      if (internal::s_print != (undefined *)0x0) {
        (*(code *)internal::s_print)
                  ("AddUvMesh: Meshes and UV meshes cannot be added to the same atlas.\n");
      }
      atlas_local._4_4_ = Error;
    }
  }
  return atlas_local._4_4_;
}

Assistant:

AddMeshError AddUvMesh(Atlas *atlas, const UvMeshDecl &decl)
{
	XA_DEBUG_ASSERT(atlas);
	if (!atlas) {
		XA_PRINT_WARNING("AddUvMesh: atlas is null.\n");
		return AddMeshError::Error;
	}
	Context *ctx = (Context *)atlas;
	if (!ctx->meshes.isEmpty()) {
		XA_PRINT_WARNING("AddUvMesh: Meshes and UV meshes cannot be added to the same atlas.\n");
		return AddMeshError::Error;
	}
#if XA_PROFILE
	if (ctx->uvMeshInstances.isEmpty())
		internal::s_profile.addMeshRealStart = std::chrono::high_resolution_clock::now();
#endif
	XA_PROFILE_START(addMeshCopyData)
	const bool hasIndices = decl.indexCount > 0;
	const uint32_t indexCount = hasIndices ? decl.indexCount : decl.vertexCount;
	XA_PRINT("Adding UV mesh %d: %u vertices, %u triangles\n", ctx->uvMeshes.size(), decl.vertexCount, indexCount / 3);
	// Expecting triangle faces.
	if ((indexCount % 3) != 0)
		return AddMeshError::InvalidIndexCount;
	if (hasIndices) {
		// Check if any index is out of range.
		for (uint32_t i = 0; i < indexCount; i++) {
			const uint32_t index = DecodeIndex(decl.indexFormat, decl.indexData, decl.indexOffset, i);
			if (index >= decl.vertexCount)
				return AddMeshError::IndexOutOfRange;
		}
	}
	// Create a mesh instance.
	internal::UvMeshInstance *meshInstance = XA_NEW(internal::MemTag::Default, internal::UvMeshInstance);
	meshInstance->mesh = nullptr;
	ctx->uvMeshInstances.push_back(meshInstance);
	// See if this is an instance of an already existing mesh.
	internal::UvMesh *mesh = nullptr;
	for (uint32_t m = 0; m < ctx->uvMeshes.size(); m++) {
		if (memcmp(&ctx->uvMeshes[m]->decl, &decl, sizeof(UvMeshDecl)) == 0) {
			mesh = ctx->uvMeshes[m];
			XA_PRINT("   instance of a previous UV mesh\n");
			break;
		}
	}
	if (!mesh) {
		// Copy geometry to mesh.
		mesh = XA_NEW(internal::MemTag::Default, internal::UvMesh);
		ctx->uvMeshes.push_back(mesh);
		mesh->decl = decl;
		if (decl.faceMaterialData) {
			mesh->faceMaterials.resize(decl.indexCount / 3);
			memcpy(mesh->faceMaterials.data(), decl.faceMaterialData, mesh->faceMaterials.size() * sizeof(uint32_t));
		}
		mesh->indices.resize(decl.indexCount);
		for (uint32_t i = 0; i < indexCount; i++)
			mesh->indices[i] = hasIndices ? DecodeIndex(decl.indexFormat, decl.indexData, decl.indexOffset, i) : i;
		mesh->texcoords.resize(decl.vertexCount);
		for (uint32_t i = 0; i < decl.vertexCount; i++)
			mesh->texcoords[i] = *((const internal::Vector2 *)&((const uint8_t *)decl.vertexUvData)[decl.vertexStride * i]);
		// Validate.
		mesh->faceIgnore.resize(decl.indexCount / 3);
		mesh->faceIgnore.zeroOutMemory();
		const uint32_t kMaxWarnings = 50;
		uint32_t warningCount = 0;
		for (uint32_t f = 0; f < indexCount / 3; f++) {
			bool ignore = false;
			uint32_t tri[3];
			for (uint32_t i = 0; i < 3; i++)
				tri[i] = mesh->indices[f * 3 + i];
			// Check for nan UVs.
			for (uint32_t i = 0; i < 3; i++) {
				const uint32_t vertex = tri[i];
				if (internal::isNan(mesh->texcoords[vertex].x) || internal::isNan(mesh->texcoords[vertex].y)) {
					ignore = true;
					if (++warningCount <= kMaxWarnings)
						XA_PRINT("   NAN texture coordinate in vertex %u\n", vertex);
					break;
				}
			}
			// Check for zero area faces.
			if (!ignore) {
				const internal::Vector2 &v1 = mesh->texcoords[tri[0]];
				const internal::Vector2 &v2 = mesh->texcoords[tri[1]];
				const internal::Vector2 &v3 = mesh->texcoords[tri[2]];
				const float area = fabsf(((v2.x - v1.x) * (v3.y - v1.y) - (v3.x - v1.x) * (v2.y - v1.y)) * 0.5f);
				if (area <= internal::kAreaEpsilon) {
					ignore = true;
					if (++warningCount <= kMaxWarnings)
						XA_PRINT("   Zero area face: %d, indices (%d %d %d), area is %f\n", f, tri[0], tri[1], tri[2], area);
				}
			}
			if (ignore)
				mesh->faceIgnore.set(f);
		}
		if (warningCount > kMaxWarnings)
			XA_PRINT("   %u additional warnings truncated\n", warningCount - kMaxWarnings);
	}
	meshInstance->mesh = mesh;
	XA_PROFILE_END(addMeshCopyData)
	return AddMeshError::Success;
}